

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokenizer::CTcTokenizer(CTcTokenizer *this,CResLoader *res_loader,char *default_charset)

{
  long *plVar1;
  char *pcVar2;
  CCharmapToUni *pCVar3;
  undefined8 *puVar4;
  void *pvVar5;
  CVmHashTable *this_00;
  CVmHashEntry *entry;
  CTcTokFileDesc *in_RDX;
  CTcTokFileDesc *in_RSI;
  CResLoader *in_RDI;
  CTcMacroRsc *rsc;
  kwdef *kwp;
  char timebuf [50];
  char *tstr;
  tm *tblk;
  time_t timer;
  int i;
  CTcTokenizer *in_stack_fffffffffffffeb8;
  CTcTokenizer *in_stack_fffffffffffffec0;
  CTcTokString *in_stack_fffffffffffffec8;
  int iVar6;
  CTcTokenizer *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  CTcTokenizer *in_stack_fffffffffffffee0;
  CTcTokenizer *this_01;
  CTcTokString *this_02;
  kwdef *local_80;
  CTcTokFileDesc *local_40;
  tm *local_38;
  CTcTokFileDesc *local_30;
  int local_28;
  CTcTokFileDesc *local_18;
  CTcTokFileDesc *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  utf8_ptr::utf8_ptr((utf8_ptr *)(in_RDI + 9));
  this_02 = (CTcTokString *)(in_RDI + 10);
  CTcTokString::CTcTokString(this_02);
  CTcTokString::CTcTokString((CTcTokString *)(in_RDI + 0xc));
  CTcTokString::CTcTokString((CTcTokString *)(in_RDI + 0xe));
  CTcTokString::CTcTokString((CTcTokString *)(in_RDI + 0x10));
  tok_embed_ctx::tok_embed_ctx((tok_embed_ctx *)0x28e285);
  tok_embed_ctx::tok_embed_ctx((tok_embed_ctx *)0x28e29b);
  tok_embed_ctx::tok_embed_ctx((tok_embed_ctx *)0x28e2b1);
  CTcToken::CTcToken((CTcToken *)&in_RDI[0xcc].exe_filename_);
  CTcToken::CTcToken((CTcToken *)(in_RDI + 0xcf));
  in_RDI->exe_filename_ = (char *)local_10;
  in_RDI[5].exe_filename_ = (char *)0x0;
  in_RDI[0xd2].exe_filename_ = (char *)0x0;
  *(undefined4 *)&in_RDI[8].exe_filename_ = 0;
  in_RDI[6].root_dir_ = (char *)0x0;
  in_RDI[6].exe_filename_ = (char *)0x0;
  in_RDI[7].root_dir_ = (char *)0x0;
  in_RDI[8].root_dir_ = (char *)0x0;
  in_RDI[7].exe_filename_ = (char *)0x0;
  clear_linebuf(in_stack_fffffffffffffec0);
  CTcTokString::ensure_space
            ((CTcTokString *)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
  CTcTokString::ensure_space
            ((CTcTokString *)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
  start_new_line(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  iVar6 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  pcVar2 = lib_copy_str((char *)in_stack_fffffffffffffec0);
  in_RDI[1].root_dir_ = pcVar2;
  in_RDI[1].exe_filename_ = (char *)0x0;
  if (local_18 != (CTcTokFileDesc *)0x0) {
    pCVar3 = CCharmapToUni::load(in_RDI,(char *)this_02);
    in_RDI[1].exe_filename_ = (char *)pCVar3;
  }
  if (in_RDI[1].exe_filename_ == (char *)0x0) {
    pcVar2 = (char *)operator_new(0x210);
    memset(pcVar2,0,0x210);
    CCharmapToUniASCII::CCharmapToUniASCII((CCharmapToUniASCII *)in_stack_fffffffffffffec0);
    in_RDI[1].exe_filename_ = pcVar2;
  }
  *(byte *)&in_RDI->root_dir_ = *(byte *)&in_RDI->root_dir_ & 0xfb;
  *(byte *)&in_RDI->root_dir_ = *(byte *)&in_RDI->root_dir_ & 0xef;
  *(byte *)&in_RDI->root_dir_ = *(byte *)&in_RDI->root_dir_ & 0xf7;
  *(undefined4 *)&in_RDI[0xd6].exe_filename_ = 1;
  in_RDI[2].root_dir_ = (char *)0x0;
  *(undefined4 *)((long)&in_RDI->root_dir_ + 4) = 1;
  *(byte *)&in_RDI->root_dir_ = *(byte *)&in_RDI->root_dir_ & 0xfe;
  *(byte *)&in_RDI->root_dir_ = *(byte *)&in_RDI->root_dir_ & 0xfd;
  in_RDI[3].root_dir_ = (char *)0x0;
  in_RDI[2].exe_filename_ = (char *)0x0;
  *(undefined4 *)&in_RDI[0x12].root_dir_ = 0;
  *(undefined4 *)((long)&in_RDI[0x12].root_dir_ + 4) = 0;
  *(undefined4 *)&in_RDI[0x33].exe_filename_ = 0;
  *(undefined4 *)&in_RDI[0xca].root_dir_ = 0;
  *(byte *)&in_RDI->root_dir_ = *(byte *)&in_RDI->root_dir_ & 0xdf;
  in_RDI[3].exe_filename_ = (char *)0x0;
  in_RDI[4].root_dir_ = (char *)0x0;
  in_RDI[4].exe_filename_ = (char *)0x0;
  in_RDI[5].root_dir_ = (char *)0x0;
  init_src_block_list(in_stack_fffffffffffffed0);
  pcVar2 = (char *)operator_new(0x28);
  puVar4 = (undefined8 *)operator_new(8);
  *puVar4 = 0;
  CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)in_stack_fffffffffffffec0);
  CTcBasicMacroTable::CTcBasicMacroTable
            ((CTcBasicMacroTable *)in_stack_fffffffffffffee0,
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (CVmHashFunc *)in_stack_fffffffffffffed0,iVar6);
  in_RDI[0xd3].root_dir_ = pcVar2;
  pcVar2 = (char *)operator_new(0x20);
  puVar4 = (undefined8 *)operator_new(8);
  *puVar4 = 0;
  CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)in_stack_fffffffffffffec0);
  CVmHashTable::CVmHashTable
            ((CVmHashTable *)in_stack_fffffffffffffed0,iVar6,
             (CVmHashFunc *)in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  in_RDI[0xd3].exe_filename_ = pcVar2;
  plVar1 = (long *)in_RDI[0xd3].root_dir_;
  pvVar5 = operator_new(0x50);
  CTcHashEntryPpLINE::CTcHashEntryPpLINE
            ((CTcHashEntryPpLINE *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  (**(code **)(*plVar1 + 0x10))(plVar1,pvVar5);
  plVar1 = (long *)in_RDI[0xd3].root_dir_;
  pvVar5 = operator_new(0x50);
  CTcHashEntryPpFILE::CTcHashEntryPpFILE
            ((CTcHashEntryPpFILE *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  (**(code **)(*plVar1 + 0x10))(plVar1,pvVar5);
  local_30 = (CTcTokFileDesc *)time((time_t *)0x0);
  local_38 = localtime((time_t *)&stack0xffffffffffffffd0);
  local_40 = (CTcTokFileDesc *)asctime(local_38);
  sprintf(&stack0xffffffffffffff88,"\'%.3s %2d %4d\'",&local_40->field_0x4,
          (ulong)(uint)local_38->tm_mday,(ulong)(local_38->tm_year + 0x76c));
  add_define(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  this_01 = (CTcTokenizer *)&stack0xffffffffffffff88;
  sprintf((char *)this_01,"\'%.8s\'",(undefined1 *)((long)&local_40->fname_ + 3));
  add_define(this_01,in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  in_RDI[0xd5].root_dir_ = (char *)0x0;
  in_RDI[0xd4].exe_filename_ = (char *)0x0;
  for (local_28 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20), local_28 < 7;
      local_28 = local_28 + 1) {
    pcVar2 = (char *)operator_new(0x70);
    CTcMacroRsc::CTcMacroRsc((CTcMacroRsc *)this_01);
    *(char **)(pcVar2 + 0x68) = in_RDI[0xd4].exe_filename_;
    in_RDI[0xd4].exe_filename_ = pcVar2;
    *(char **)(pcVar2 + 0x60) = in_RDI[0xd5].root_dir_;
    in_RDI[0xd5].root_dir_ = pcVar2;
  }
  this_00 = (CVmHashTable *)operator_new(0x20);
  entry = (CVmHashEntry *)operator_new(8);
  entry->_vptr_CVmHashEntry = (_func_int **)0x0;
  CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)in_stack_fffffffffffffec0);
  CVmHashTable::CVmHashTable
            (this_00,(int)((ulong)entry >> 0x20),(CVmHashFunc *)in_stack_fffffffffffffec0,iVar6);
  in_RDI[0xd4].root_dir_ = (char *)this_00;
  for (local_80 = CTcTokenizer::kwlist; local_80->kw_text != (char *)0x0; local_80 = local_80 + 1) {
    pvVar5 = operator_new(0x28);
    CTcHashEntryKw::CTcHashEntryKw
              ((CTcHashEntryKw *)this_00,(textchar_t *)entry,(tc_toktyp_t)((ulong)pvVar5 >> 0x20));
    CVmHashTable::add(this_00,entry);
  }
  in_RDI[0xd2].root_dir_ = (char *)0x0;
  in_RDI[0xd1].exe_filename_ = (char *)0x0;
  in_RDI[0xd5].exe_filename_ = (char *)0x0;
  in_RDI[0xd6].root_dir_ = (char *)0x0;
  CTcToken::settyp((CTcToken *)&in_RDI[0xcc].exe_filename_,TOKT_NULLTOK);
  CTcToken::set_text((CTcToken *)&in_RDI[0xcc].exe_filename_,"<Start of Input>",0x10);
  return;
}

Assistant:

CTcTokenizer::CTcTokenizer(CResLoader *res_loader,
                           const char *default_charset)
{
    int i;
    os_time_t timer;
    struct tm *tblk;
    const char *tstr;
    char timebuf[50];
    struct kwdef
    {
        const char *kw_text;
        tc_toktyp_t kw_tok_id;
    };
    static const kwdef kwlist[] =
    {
        { "self", TOKT_SELF },
        { "targetprop", TOKT_TARGETPROP },
        { "targetobj", TOKT_TARGETOBJ },
        { "definingobj", TOKT_DEFININGOBJ },
        { "inherited", TOKT_INHERITED },
        { "delegated", TOKT_DELEGATED },
        { "argcount", TOKT_ARGCOUNT },
        { "if", TOKT_IF },
        { "else", TOKT_ELSE },
        { "for", TOKT_FOR },
        { "while", TOKT_WHILE },
        { "do", TOKT_DO },
        { "switch", TOKT_SWITCH },
        { "case", TOKT_CASE },
        { "default", TOKT_DEFAULT },
        { "goto", TOKT_GOTO },
        { "break", TOKT_BREAK },
        { "continue", TOKT_CONTINUE },
//      { "and", TOKT_AND },
//      { "or", TOKT_OR },
//      { "not", TOKT_NOT },
        { "function", TOKT_FUNCTION },
        { "return", TOKT_RETURN },
        { "local", TOKT_LOCAL },
        { "object", TOKT_OBJECT },
        { "nil", TOKT_NIL },
        { "true", TOKT_TRUE },
        { "pass", TOKT_PASS },
        { "external", TOKT_EXTERNAL },
        { "extern", TOKT_EXTERN },
        { "formatstring", TOKT_FORMATSTRING },
        { "class", TOKT_CLASS },
        { "replace", TOKT_REPLACE },
        { "modify", TOKT_MODIFY },
        { "new", TOKT_NEW },
//      { "delete", TOKT_DELETE },
        { "throw", TOKT_THROW },
        { "try", TOKT_TRY },
        { "catch", TOKT_CATCH },
        { "finally", TOKT_FINALLY },
        { "intrinsic", TOKT_INTRINSIC },
        { "dictionary", TOKT_DICTIONARY },
        { "grammar", TOKT_GRAMMAR },
        { "enum", TOKT_ENUM },
        { "template", TOKT_TEMPLATE },
        { "static", TOKT_STATIC },
        { "foreach", TOKT_FOREACH },
        { "export", TOKT_EXPORT },
        { "propertyset", TOKT_PROPERTYSET },
        { "transient", TOKT_TRANSIENT },
        { "replaced", TOKT_REPLACED },
        { "property", TOKT_PROPERTY },
        { "operator", TOKT_OPERATOR },
        { "method", TOKT_METHOD },
        { "invokee", TOKT_INVOKEE },

//      { "void", TOKT_VOID },
//      { "int", TOKT_INT },
//      { "string", TOKT_STRING },
//      { "list", TOKT_LIST },
//      { "boolean", TOKT_BOOLEAN },
//      { "any", TOKT_ANY },

        /* end-of-table marker */
        { 0, TOKT_INVALID }
    };
    const kwdef *kwp;
    
    /* remember my resource loader */
    res_loader_ = res_loader;

    /* there's no stream yet */
    str_ = 0;

    /* no external source yet */
    ext_src_ = 0;

    /* start numbering the file descriptors at zero */
    next_filedesc_id_ = 0;

    /* there are no file descriptors yet */
    desc_head_ = 0;
    desc_tail_ = 0;
    desc_list_ = 0;
    desc_list_cnt_ = desc_list_alo_ = 0;

    /* empty out the input line buffer */
    clear_linebuf();

    /* start out with a minimal line buffer size */
    linebuf_.ensure_space(4096);
    expbuf_.ensure_space(4096);

    /* set up at the beginning of the input line buffer */
    start_new_line(&linebuf_, 0);

    /* remember the default character set */
    default_charset_ = lib_copy_str(default_charset);

    /* we don't have a default character mapper yet */
    default_mapper_ = 0;

    /* create an input mapper for the default character set, if specified */
    if (default_charset != 0)
        default_mapper_ = CCharmapToUni::load(res_loader, default_charset);

    /* 
     *   if the default character set wasn't specified, or we failed to
     *   load a mapper for the specified character set, use a plain ASCII
     *   mapper 
     */
    if (default_mapper_ == 0)
        default_mapper_ = new CCharmapToUniASCII();

    /* presume we're not in preprocessor-only mode */
    pp_only_mode_ = FALSE;

    /* presume we're not in list-includes mode */
    list_includes_mode_ = FALSE;

    /* presume we're not in test report mode */
    test_report_mode_ = FALSE;

    /* allow preprocessing directives */
    allow_pp_ = TRUE;

    /* there are no previously-included files yet */
    prev_includes_ = 0;

    /* by default, use the "collapse" mode for newlines in strings */
    string_newline_spacing_ = NEWLINE_SPACING_COLLAPSE;

    /* start out with ALL_ONCE mode off */
    all_once_ = FALSE;

    /* by default, ignore redundant includes without warning */
    warn_on_ignore_incl_ = FALSE;

    /* there are no include path entries yet */
    incpath_head_ = incpath_tail_ = 0;

    /* not in a quoted string yet */
    in_quote_ = '\0';
    in_triple_ = FALSE;

    /* not in a #if block yet */
    if_sp_ = 0;
    if_false_level_ = 0;

    /* not processing a preprocessor constant expression */
    in_pp_expr_ = FALSE;

    /* we don't have a current or appended line yet */
    last_desc_ = 0;
    last_linenum_ = 0;
    appended_desc_ = 0;
    appended_linenum_ = 0;

    /* allocate the first token-list block */
    init_src_block_list();

    /* create the #define and #undef symbol tables */
    defines_ = new CTcBasicMacroTable(512, new CVmHashFuncCS(), TRUE);
    undefs_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* create the special __LINE__ and __FILE__ macros */
    defines_->add(new CTcHashEntryPpLINE(this));
    defines_->add(new CTcHashEntryPpFILE(this));

    /* get the current time and date */
    timer = os_time(0);
    tblk = os_localtime(&timer);
    tstr = asctime(tblk);

    /* 
     *   add the __DATE__ macro - the format is "Mmm dd yyyy", where "Mmm"
     *   is the three-letter month name generated by asctime(), "dd" is
     *   the day of the month, with a leading space for numbers less than
     *   ten, and "yyyy" is the year. 
     */
    sprintf(timebuf, "'%.3s %2d %4d'",
            tstr + 4, tblk->tm_mday, tblk->tm_year + 1900);
    add_define("__DATE__", timebuf);

    /* add the __TIME__ macro - 24-hour "hh:mm:ss" format */
    sprintf(timebuf, "'%.8s'", tstr + 11);
    add_define("__TIME__", timebuf);

    /* 
     *   Allocate a pool of macro resources.  The number we start with is
     *   arbitrary, since we'll add more as needed, but we want to try to
     *   allocate enough up front that we avoid time-consuming memory
     *   allocations later.  On the other hand, we don't want to
     *   pre-allocate a huge number of objects that we'll never use.  
     */
    for (macro_res_avail_ = 0, macro_res_head_ = 0, i = 0 ; i < 7 ; ++i)
    {
        CTcMacroRsc *rsc;
        
        /* allocate a new object */
        rsc = new CTcMacroRsc();

        /* add it onto the master list */
        rsc->next_ = macro_res_head_;
        macro_res_head_ = rsc;

        /* add it onto the available list */
        rsc->next_avail_ = macro_res_avail_;
        macro_res_avail_ = rsc;
    }

    /* create the keyword hash table */
    kw_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* populate the keyword table */
    for (kwp = kwlist ; kwp->kw_text != 0 ; ++kwp)
        kw_->add(new CTcHashEntryKw(kwp->kw_text, kwp->kw_tok_id));

    /* no ungot tokens yet */
    unget_head_ = unget_cur_ = 0;

    /* no string capture file */
    string_fp_ = 0;
    string_fp_map_ = 0;

    /* there's no current token yet */
    curtok_.settyp(TOKT_NULLTOK);
    curtok_.set_text("<Start of Input>", 16);
}